

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
::assert_key_is_not_empty_or_deleted<s2shapeutil::ShapeEdgeId>
          (dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
           *this,ShapeEdgeId *key)

{
  type tVar1;
  
  if ((this->settings).
      super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
      .use_empty_ == false) {
    __assert_fail("settings.use_empty() && \"set_empty_key() was not called\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x3f4,
                  "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>, K = s2shapeutil::ShapeEdgeId]"
                 );
  }
  tVar1 = (this->key_info).empty;
  if (tVar1.edge_id != key->edge_id || key->shape_id != tVar1.shape_id) {
    if (((this->settings).
         super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
         .use_deleted_ == true) &&
       (tVar1 = (this->key_info).delkey,
       key->edge_id == tVar1.edge_id && key->shape_id == tVar1.shape_id)) {
      __assert_fail("(!settings.use_deleted() || !equals(key, key_info.delkey)) && \"Using the deleted key as a regular key\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x3f8,
                    "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>, K = s2shapeutil::ShapeEdgeId]"
                   );
    }
    return;
  }
  __assert_fail("!equals(key, key_info.empty) && \"Using the empty key as a regular key\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                ,0x3f6,
                "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::assert_key_is_not_empty_or_deleted(const K &) const [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>, K = s2shapeutil::ShapeEdgeId]"
               );
}

Assistant:

void assert_key_is_not_empty_or_deleted(const K& key) const {
    assert(settings.use_empty() && "set_empty_key() was not called");
    assert(!equals(key, key_info.empty) &&
           "Using the empty key as a regular key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey))
           && "Using the deleted key as a regular key");
  }